

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setModel(QComboBox *this,QAbstractItemModel *model)

{
  QComboBoxPrivate *this_00;
  QAbstractItemModel *pQVar1;
  long *plVar2;
  bool bVar3;
  QCompleter *pQVar4;
  QItemSelectionModel *signal;
  long in_FS_OFFSET;
  Object local_48 [8];
  QModelIndex local_40;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (model == (QAbstractItemModel *)0x0) {
    local_40.r = 2;
    local_40.m.ptr._4_4_ = 0;
    local_40.c = 0;
    local_40.i._0_4_ = 0;
    local_40.i._4_4_ = 0;
    local_40.m.ptr._0_4_ = 0;
    local_28 = "default";
    QMessageLogger::warning((char *)&local_40,"QComboBox::setModel: cannot set a 0 model");
  }
  else {
    this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
    if (this_00->model != model) {
      if (this_00->lineEdit != (QLineEdit *)0x0) {
        pQVar4 = QLineEdit::completer(this_00->lineEdit);
        if (pQVar4 != (QCompleter *)0x0) {
          pQVar4 = QLineEdit::completer(this_00->lineEdit);
          QCompleter::setModel(pQVar4,model);
        }
      }
      QComboBoxPrivate::disconnectModel(this_00);
      pQVar1 = this_00->model;
      if ((pQVar1 != (QAbstractItemModel *)0x0) &&
         (*(QComboBox **)(*(long *)(pQVar1 + 8) + 0x10) == this)) {
        (**(code **)(*(long *)pQVar1 + 0x20))();
      }
      this_00->model = model;
      bVar3 = QPointer::operator_cast_to_bool((QPointer *)&this_00->container);
      if (bVar3) {
        plVar2 = *(long **)((this_00->container).wp.value + 0x50);
        (**(code **)(*plVar2 + 0x1c8))(plVar2,model);
        signal = QAbstractItemView::selectionModel
                           (*(QAbstractItemView **)((this_00->container).wp.value + 0x50));
        local_40.r = 0x3b0bfc;
        local_40.c = 0;
        local_40.i._0_4_ = 0;
        local_40.i._4_4_ = 0;
        QObjectPrivate::
        connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QComboBoxPrivate::*)(QModelIndex_const&)>
                  (local_48,(offset_in_QItemSelectionModel_to_subr)signal,
                   (Object *)QItemSelectionModel::currentChanged,0,(ConnectionType)this_00);
        QMetaObject::Connection::~Connection((Connection *)local_48);
      }
      QComboBoxPrivate::connectModel(this_00);
      local_40.r = -1;
      local_40.c = -1;
      local_40.i._0_4_ = 0;
      local_40.i._4_4_ = 0;
      local_40.m.ptr._0_4_ = 0;
      local_40.m.ptr._4_4_ = 0;
      setRootModelIndex(this,&local_40);
      QComboBoxPrivate::trySetValidIndex(this_00);
      QComboBoxPrivate::modelChanged(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::setModel(QAbstractItemModel *model)
{
    Q_D(QComboBox);

    if (Q_UNLIKELY(!model)) {
        qWarning("QComboBox::setModel: cannot set a 0 model");
        return;
    }

    if (model == d->model)
        return;

#if QT_CONFIG(completer)
    if (d->lineEdit && d->lineEdit->completer())
        d->lineEdit->completer()->setModel(model);
#endif
    d->disconnectModel();
    if (d->model && d->model->QObject::parent() == this) {
        delete d->model;
        d->model = nullptr;
    }

    d->model = model;

    if (d->container) {
        d->container->itemView()->setModel(model);
        QObjectPrivate::connect(d->container->itemView()->selectionModel(),
                                &QItemSelectionModel::currentChanged,
                                d, &QComboBoxPrivate::emitHighlighted, Qt::UniqueConnection);
    }

    d->connectModel();

    setRootModelIndex(QModelIndex());

    d->trySetValidIndex();
    d->modelChanged();
}